

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O2

void helper_v7m_vlstm_aarch64(CPUARMState_conflict *env,uint32_t fptr)

{
  uint32_t *puVar1;
  uint64_t uVar2;
  _Bool _Var3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  target_ulong ptr;
  uint uVar9;
  uintptr_t unaff_retaddr;
  
  if ((env->v7m).secure == 0) {
    __assert_fail("env->v7m.secure",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                  ,0x3c4,"void helper_v7m_vlstm_aarch64(CPUARMState *, uint32_t)");
  }
  if (((env->v7m).control[1] & 8) == 0) {
    return;
  }
  ptr = (target_ulong)fptr;
  uVar6 = (env->v7m).fpccr[1];
  uVar7 = *(uint *)((long)(env->v7m).fpccr + (ulong)(uVar6 & 4));
  iVar4 = arm_current_el(env);
  _Var3 = v7m_cpacr_pass(env,true,iVar4 != 0);
  if (_Var3) {
    if ((uVar7 & 1) == 0) {
      if ((fptr & 7) == 0) {
        if ((uVar6 >> 0x1e & 1) == 0) {
          uVar7 = 0;
          for (uVar9 = 0; uVar9 < (uVar6 >> 0x16 & 0x10) + 0x10; uVar9 = uVar9 + 2) {
            uVar2 = (env->vfp).zregs[uVar9 >> 2].d[uVar7 & 1];
            uVar8 = (int)ptr + 8;
            if (0xf < uVar9) {
              ptr = (target_ulong)uVar8;
            }
            cpu_stl_data_ra_aarch64(env,ptr,(uint32_t)uVar2,unaff_retaddr);
            cpu_stl_data_ra_aarch64
                      (env,(ulong)((uint)ptr | 4),(uint32_t)(uVar2 >> 0x20),unaff_retaddr);
            uVar7 = uVar7 + 1;
            ptr = (target_ulong)uVar8;
          }
          uVar5 = vfp_get_fpscr_aarch64(env);
          cpu_stl_data_ra_aarch64(env,(ulong)(fptr + 0x40),uVar5,unaff_retaddr);
          if ((uVar6 >> 0x1a & 1) != 0) {
            uVar6 = 0;
            for (uVar7 = 0; uVar7 < 0x20; uVar7 = uVar7 + 2) {
              (env->vfp).zregs[uVar7 >> 2].d[uVar6 & 1] = 0;
              uVar6 = uVar6 + 1;
            }
            vfp_set_fpscr_aarch64(env,0);
          }
        }
        puVar1 = (env->v7m).control + 1;
        *(byte *)puVar1 = (byte)*puVar1 & 0xfb;
        return;
      }
      uVar5 = 0x16;
    }
    else {
      uVar5 = 0x15;
    }
  }
  else {
    uVar5 = 0x11;
  }
  raise_exception_ra_aarch64(env,uVar5,0,1,unaff_retaddr);
}

Assistant:

void HELPER(v7m_vlstm)(CPUARMState *env, uint32_t fptr)
{
    /* fptr is the value of Rn, the frame pointer we store the FP regs to */
    bool s = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_S_MASK;
    bool lspact = env->v7m.fpccr[s] & R_V7M_FPCCR_LSPACT_MASK;
    uintptr_t ra = GETPC();

    assert(env->v7m.secure);

    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_SFPA_MASK)) {
        return;
    }

    /* Check access to the coprocessor is permitted */
    if (!v7m_cpacr_pass(env, true, arm_current_el(env) != 0)) {
        raise_exception_ra(env, EXCP_NOCP, 0, 1, GETPC());
    }

    if (lspact) {
        /* LSPACT should not be active when there is active FP state */
        raise_exception_ra(env, EXCP_LSERR, 0, 1, GETPC());
    }

    if (fptr & 7) {
        raise_exception_ra(env, EXCP_UNALIGNED, 0, 1, GETPC());
    }

    /*
     * Note that we do not use v7m_stack_write() here, because the
     * accesses should not set the FSR bits for stacking errors if they
     * fail. (In pseudocode terms, they are AccType_NORMAL, not AccType_STACK
     * or AccType_LAZYFP). Faults in cpu_stl_data_ra() will throw exceptions
     * and longjmp out.
     */
    if (!(env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_LSPEN_MASK)) {
        bool ts = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_TS_MASK;
        int i;

        for (i = 0; i < (ts ? 32 : 16); i += 2) {
            uint64_t dn = *aa32_vfp_dreg(env, i / 2);
            uint32_t faddr = fptr + 4 * i;
            uint32_t slo = extract64(dn, 0, 32);
            uint32_t shi = extract64(dn, 32, 32);

            if (i >= 16) {
                faddr += 8; /* skip the slot for the FPSCR */
            }
            cpu_stl_data_ra(env, faddr, slo, ra);
            cpu_stl_data_ra(env, faddr + 4, shi, ra);
        }
        cpu_stl_data_ra(env, fptr + 0x40, vfp_get_fpscr(env), ra);

        /*
         * If TS is 0 then s0 to s15 and FPSCR are UNKNOWN; we choose to
         * leave them unchanged, matching our choice in v7m_preserve_fp_state.
         */
        if (ts) {
            for (i = 0; i < 32; i += 2) {
                *aa32_vfp_dreg(env, i / 2) = 0;
            }
            vfp_set_fpscr(env, 0);
        }
    } else {
        v7m_update_fpccr(env, fptr, false);
    }

    env->v7m.control[M_REG_S] &= ~R_V7M_CONTROL_FPCA_MASK;
}